

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O3

void __thiscall
qclab::qgates::SWAP<std::complex<double>_>::SWAP
          (SWAP<std::complex<double>_> *this,int qubit0,int qubit1)

{
  int iVar1;
  char *__assertion;
  
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00134550;
  iVar1 = qubit0;
  if (qubit1 < qubit0) {
    iVar1 = qubit1;
  }
  (this->qubits_)._M_elems[0] = iVar1;
  iVar1 = qubit1;
  if (qubit1 < qubit0) {
    iVar1 = qubit0;
  }
  (this->qubits_)._M_elems[1] = iVar1;
  if (qubit0 < 0) {
    __assertion = "qubits[0] >= 0";
  }
  else {
    if (-1 < qubit1) {
      if (qubit0 != qubit1) {
        iVar1 = qubit0;
        if ((uint)qubit1 < (uint)qubit0) {
          iVar1 = qubit1;
        }
        (this->qubits_)._M_elems[0] = iVar1;
        if ((uint)qubit1 < (uint)qubit0) {
          qubit1 = qubit0;
        }
        (this->qubits_)._M_elems[1] = qubit1;
        return;
      }
      __assert_fail("qubits[0] != qubits[1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/SWAP.hpp"
                    ,0x3e,
                    "virtual void qclab::qgates::SWAP<std::complex<double>>::setQubits(const int *) [T = std::complex<double>]"
                   );
    }
    __assertion = "qubits[1] >= 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/SWAP.hpp"
                ,0x3d,
                "virtual void qclab::qgates::SWAP<std::complex<double>>::setQubits(const int *) [T = std::complex<double>]"
               );
}

Assistant:

SWAP( const int qubit0 , const int qubit1 )
        : qubits_( { std::min( qubit0 , qubit1 ) ,
                     std::max( qubit0 , qubit1 ) } )
        {
          const int qubits[] = { qubit0 , qubit1 } ;
          setQubits( &qubits[0] ) ;
        }